

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

qint64 __thiscall
QFSFileEnginePrivate::readLineFdFh(QFSFileEnginePrivate *this,char *data,qint64 maxlen)

{
  long lVar1;
  int iVar2;
  QAbstractFileEngine *this_00;
  __off64_t _Var3;
  char *pcVar4;
  __off64_t _Var5;
  int in_EDX;
  char *in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 lineLength;
  off64_t oldPos;
  QFSFileEngine *q;
  QString *in_stack_ffffffffffffff90;
  FileError error;
  qint64 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QAbstractFileEngine;
  if (in_RDI->fh == (FILE *)0x0) {
    local_28 = QAbstractFileEngine::readLine
                         (this_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    _Var3 = ftello64((FILE *)in_RDI->fh);
    error = (FileError)((ulong)this_00 >> 0x20);
    pcVar4 = fgets(in_RSI,in_EDX + 1,(FILE *)in_RDI->fh);
    if (pcVar4 == (char *)0x0) {
      iVar2 = feof((FILE *)in_RDI->fh);
      if (iVar2 == 0) {
        __errno_location();
        QSystemError::stdString(error);
        QAbstractFileEngine::setError((QAbstractFileEngine *)in_RDI,error,in_stack_ffffffffffffff90)
        ;
        QString::~QString((QString *)0x135c31);
      }
      local_28 = 0xffffffffffffffff;
    }
    else {
      _Var5 = ftello64((FILE *)in_RDI->fh);
      local_28 = _Var5 - _Var3;
      if ((long)local_28 < 1) {
        local_28 = qstrlen((char *)in_stack_ffffffffffffff90);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

qint64 QFSFileEnginePrivate::readLineFdFh(char *data, qint64 maxlen)
{
    Q_Q(QFSFileEngine);
    if (!fh)
        return q->QAbstractFileEngine::readLine(data, maxlen);

    QT_OFF_T oldPos = 0;
#ifdef Q_OS_WIN
    bool seq = q->isSequential();
    if (!seq)
#endif
        oldPos = QT_FTELL(fh);

    // QIODevice::readLine() passes maxlen - 1 to QFile::readLineData()
    // because it has made space for the '\0' at the end of data.  But fgets
    // does the same, so we'd get two '\0' at the end - passing maxlen + 1
    // solves this.
    if (!fgets(data, int(maxlen + 1), fh)) {
        if (!feof(fh)) // Doesn't change errno
            q->setError(QFile::ReadError, QSystemError::stdString(errno));
        return -1;              // error
    }

#ifdef Q_OS_WIN
    if (seq)
        return qstrlen(data);
#endif

    qint64 lineLength = QT_FTELL(fh) - oldPos;
    return lineLength > 0 ? lineLength : qstrlen(data);
}